

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleNonAnsiPort(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if (((kind == Identifier) || (kind == OpenBrace)) || (kind == Comma || kind == Dot)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleNonAnsiPort(TokenKind kind) {
    switch (kind) {
        case TokenKind::Dot:
        case TokenKind::Comma:
        case TokenKind::Identifier:
        case TokenKind::OpenBrace:
            return true;
        default:
            return false;
    }
}